

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O0

uint32_t float_to_uint_int(uint32_t fint)

{
  uint32_t uVar1;
  float in_EDI;
  anon_union_4_2_947300a4 v;
  
  uVar1 = float_to_uint(in_EDI);
  return uVar1;
}

Assistant:

static inline uint32_t
float_to_uint_int (uint32_t fint)
{
    union
    {
        uint32_t i;
        float    f;
    } v;
    v.i = fint;
    return float_to_uint (v.f);
}